

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::Parser(Parser *this,char *filepath)

{
  allocator<char> local_19;
  char *local_18;
  char *filepath_local;
  Parser *this_local;
  
  local_18 = filepath;
  filepath_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,filepath,&local_19);
  std::allocator<char>::~allocator(&local_19);
  this->klex = (Klex *)0x0;
  Token::Token(&this->currentToken);
  this->functionCounter = 0;
  return;
}

Assistant:

Parser::Parser(const char *filepath) : filepath(filepath), klex(nullptr) { }